

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::LinkCtorCacheToGuardedProperties(Lowerer *this,JITTimeConstructorCache *ctorCache)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  JITTimeConstructorCache *this_00;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  FunctionJITTimeInfo *pFVar9;
  undefined4 *puVar10;
  ObjTypeSpecFldInfo *this_01;
  JITTimeFunctionBody *pJVar11;
  intptr_t iVar12;
  JITType *this_02;
  intptr_t iVar13;
  undefined8 extraout_RAX;
  Type_conflict pBVar14;
  ulong uVar15;
  ulong uVar16;
  wchar local_d8 [4];
  char16 debugStringBuffer [42];
  JITTypeHolderBase<void> local_78;
  ulong local_70;
  char16 *local_68;
  undefined4 *local_60;
  Type_conflict local_58;
  Phases *local_50;
  JITTimeConstructorCache *local_48;
  undefined8 local_40;
  uint local_34;
  
  local_48 = ctorCache;
  pBVar8 = JITTimeConstructorCache::GetGuardedPropOps(ctorCache);
  if (pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar4 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar9);
    if (bVar4) {
      pBVar8 = JITTimeConstructorCache::GetGuardedPropOps(local_48);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      bVar4 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar9);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1fd8,
                           "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                           ,
                           "this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                          );
        if (!bVar4) goto LAB_005cd382;
        *puVar10 = 0;
      }
      if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
        if (!bVar4) {
LAB_005cd382:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar10 = 0;
      }
      pBVar14 = pBVar8->head;
      bVar5 = 0;
      if (pBVar14 != (Type_conflict)0x0) {
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        local_50 = (Phases *)&DAT_015cd718;
        local_40 = (char16 *)((ulong)local_40._4_4_ << 0x20);
        local_60 = puVar10;
        do {
          uVar16 = (pBVar14->data).word;
          local_58 = pBVar14;
          if (uVar16 != 0) {
            local_70 = (ulong)pBVar14->startIndex;
            uVar15 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            do {
              iVar3 = (int)local_70;
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
              this_01 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,(BVIndex)uVar15 + iVar3);
              local_34 = ObjTypeSpecFldInfo::GetPropertyId(this_01);
              bVar4 = ObjTypeSpecFldInfo::IsBeingAdded(this_01);
              if (((bVar4) || (bVar4 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), bVar4)) ||
                 (bVar4 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar4)) {
                bVar4 = ObjTypeSpecFldInfo::IsPoly(this_01);
                if (((bVar4) && (bVar4 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar4)) &&
                   ((bVar4 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), !bVar4 &&
                    (bVar4 = ObjTypeSpecFldInfo::UsesAccessor(this_01), !bVar4)))) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                     ,0x1fee,
                                     "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                                     ,
                                     "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                                    );
                  if (!bVar4) goto LAB_005cd382;
                  *puVar10 = 0;
                }
                pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                bVar4 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar9,local_34);
                if (bVar4) {
                  pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
                  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
                  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
                  bVar4 = Js::Phases::IsEnabled(local_50,ObjTypeSpecPhase,uVar6,uVar7);
                  if (bVar4) {
LAB_005cd247:
                    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
                    local_40 = JITTimeFunctionBody::GetDisplayName(pJVar11);
                    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                    local_68 = FunctionJITTimeInfo::GetDebugNumberSet
                                         (pFVar9,(wchar (*) [42])local_d8);
                    this_00 = local_48;
                    iVar12 = JITTimeConstructorCache::GetRuntimeCacheAddr(local_48);
                    local_78.t = (Type)JITTimeConstructorCache::GetType(this_00);
                    this_02 = JITTypeHolderBase<void>::operator->(&local_78);
                    iVar13 = JITType::GetAddr(this_02);
                    puVar10 = local_60;
                    Output::Print(L"ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"
                                  ,local_40,local_68,iVar12,iVar13,(ulong)local_34);
                    Output::Flush();
                  }
                  else {
                    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
                    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
                    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
                    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
                    bVar4 = Js::Phases::IsEnabled(local_50,TracePropertyGuardsPhase,uVar6,uVar7);
                    if (bVar4) goto LAB_005cd247;
                  }
                  Func::EnsureCtorCachesByPropertyId(this->m_func);
                  Func::LinkCtorCacheToPropertyId(this->m_func,local_34,local_48);
                  local_40 = (char16 *)
                             CONCAT44(local_40._4_4_,
                                      (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
                }
                else {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar10 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                     ,0x1ff7,"(false)",
                                     "Did we fail to create a shared property guard for a guarded property?"
                                    );
                  if (!bVar4) goto LAB_005cd382;
                  *puVar10 = 0;
                }
              }
              uVar16 = uVar16 & ~(1L << (uVar15 & 0x3f));
              lVar1 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
                }
              }
              uVar15 = (ulong)(-(uint)(uVar16 == 0) | (uint)lVar1);
            } while (uVar16 != 0);
          }
          pBVar14 = local_58->next;
        } while (pBVar14 != (Type)0x0);
        bVar5 = (byte)local_40;
      }
      goto LAB_005cd36e;
    }
  }
  bVar5 = 0;
LAB_005cd36e:
  return (bool)(bVar5 & 1);
}

Assistant:

bool
Lowerer::LinkCtorCacheToGuardedProperties(JITTimeConstructorCache* ctorCache)
{
    // We do not always have guarded properties. If the constructor is empty and the subsequent code doesn't load or store any of
    // the constructed object's properties, or if all inline caches are empty then this ctor cache doesn't guard any properties.
    if (ctorCache->GetGuardedPropOps() == nullptr)
    {
        return false;
    }

    bool linked = false;

    if (this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        linked = LinkGuardToGuardedProperties(ctorCache->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    ctorCache->GetRuntimeCacheAddr(), ctorCache->GetType()->GetAddr(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsureCtorCachesByPropertyId();
            this->m_func->LinkCtorCacheToPropertyId(propertyId, ctorCache);
        });
    }
    return linked;
}